

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O1

void jsons_print_list(lyout *out,lys_node *node,int *first)

{
  char *val;
  lys_module *plVar1;
  int *first_00;
  int *first_01;
  char *pcVar2;
  ulong uVar3;
  
  pcVar2 = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,pcVar2,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_ordering(out,node->flags,first_01);
  if (*(int *)&node[1].iffeature != 0) {
    ly_print(out,"%s\"min-elements\":{\"value\":%u}",",");
  }
  if (*(int *)((long)&node[1].iffeature + 4) != 0) {
    ly_print(out,"%s\"max-elements\":{\"value\":%u}",",");
  }
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,(lys_when *)node[1].name,(int *)0x0);
  jsons_print_musts(out,(lys_restr *)node[1].dsc,node->padding[0],(int *)0x0);
  ly_print(out,",\"keys\":[");
  if (node->padding[2] != '\0') {
    uVar3 = 0;
    do {
      pcVar2 = ",";
      if (uVar3 == 0) {
        pcVar2 = "";
      }
      ly_print(out,"%s\"%s\"",pcVar2);
      uVar3 = uVar3 + 1;
    } while (uVar3 < node->padding[2]);
  }
  ly_print(out,"]");
  first_00 = (int *)0x0;
  jsons_print_uniques(out,(lys_unique *)node[1].ext,node->padding[3],(int *)0x0);
  jsons_print_typedefs(out,(lys_tpdf *)node[1].ref,node->padding[1],first_00);
  jsons_print_nodes_(out,node->child,"groupings",0x800,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  jsons_print_nodes_(out,node->child,"actions",0x4000,(int *)0x0);
  jsons_print_nodes_(out,node->child,"notifications",0x80,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_list(struct lyout *out, const struct lys_node *node, int *first)
{
    uint8_t i;
    struct lys_node_list *list = (struct lys_node_list *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", list->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", list->ref, 1, NULL);
    jsons_print_status(out, list->flags, NULL);
    jsons_print_config(out, list->flags, NULL);
    jsons_print_ordering(out, list->flags, NULL);
    if (list->min) {
        jsons_print_min(out, list->min, NULL);
    }
    if (list->max) {
        jsons_print_max(out, list->max, NULL);
    }
    jsons_print_iffeatures(out, list->module, list->iffeature, list->iffeature_size, NULL);
    jsons_print_when(out, list->when, NULL);
    jsons_print_musts(out, list->must, list->must_size, NULL);
    ly_print(out, ",\"keys\":[");
    for (i = 0; i < list->keys_size; ++i) {
        ly_print(out, "%s\"%s\"", i ? "," : "", list->keys[i]->name);
    }
    ly_print(out, "]");
    jsons_print_uniques(out, list->unique, list->unique_size, NULL);
    jsons_print_typedefs(out, list->tpdf, list->tpdf_size, NULL);

    jsons_print_groupings(out, list->child, NULL);
    jsons_print_data(out, list->module, list->child, NULL);
    jsons_print_actions(out, list->child, NULL);
    jsons_print_notifs(out, list->child, NULL);
    ly_print(out, "}");
}